

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressbar.cpp
# Opt level: O2

void __thiscall QProgressBar::setOrientation(QProgressBar *this,Orientation orientation)

{
  QProgressBarPrivate *this_00;
  bool bVar1;
  QSizePolicy policy;
  long in_FS_OFFSET;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QProgressBarPrivate **)&(this->super_QWidget).field_0x8;
  if (this_00->orientation != orientation) {
    this_00->orientation = orientation;
    bVar1 = QWidget::testAttribute_helper(&this->super_QWidget,WA_WState_OwnSizePolicy);
    if (!bVar1) {
      local_1c.bits = (Bits)QWidget::sizePolicy(&this->super_QWidget);
      policy.field_0 =
           (anon_union_4_2_313b0b05_for_QSizePolicy_1)QSizePolicy::Bits::transposed(&local_1c.bits);
      QWidget::setSizePolicy(&this->super_QWidget,policy);
      QWidget::setAttribute(&this->super_QWidget,WA_WState_OwnSizePolicy,false);
    }
    QProgressBarPrivate::resetLayoutItemMargins(this_00);
    QWidget::update(&this->super_QWidget);
    QWidget::updateGeometry(&this->super_QWidget);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QProgressBar::setOrientation(Qt::Orientation orientation)
{
    Q_D(QProgressBar);
    if (d->orientation == orientation)
        return;
    d->orientation = orientation;
    if (!testAttribute(Qt::WA_WState_OwnSizePolicy)) {
        setSizePolicy(sizePolicy().transposed());
        setAttribute(Qt::WA_WState_OwnSizePolicy, false);
    }
    d->resetLayoutItemMargins();
    update();
    updateGeometry();
}